

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall f8n::db::Connection::UpdateReferenceCount(Connection *this,bool init)

{
  int iVar1;
  bool bVar2;
  undefined3 in_register_00000031;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if (CONCAT31(in_register_00000031,init) == 0) {
    iVar1 = UpdateReferenceCount::count + -1;
    bVar2 = UpdateReferenceCount::count < 2;
    UpdateReferenceCount::count = iVar1;
    if (bVar2) {
      sqlite3_shutdown();
      UpdateReferenceCount::count = 0;
    }
  }
  else {
    if (UpdateReferenceCount::count == 0) {
      sqlite3_initialize();
    }
    UpdateReferenceCount::count = UpdateReferenceCount::count + 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void Connection::UpdateReferenceCount(bool init) {
    std::unique_lock<std::mutex> lock(this->mutex);

    static int count = 0;

    if (init) {
        if (count == 0) {
            sqlite3_initialize();
        }

        ++count;
    }
    else {
        --count;
        if (count <= 0) {
            sqlite3_shutdown();
            count = 0;
        }
    }
}